

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_decoder_impl.cc
# Opt level: O3

bool __thiscall
draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::
DecodeAttributeConnectivitiesOnFaceLegacy
          (MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder> *this,
          CornerIndex corner)

{
  uint uVar1;
  iterator iVar2;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  pointer pAVar6;
  pointer pAVar7;
  ulong uVar8;
  uint uVar9;
  int c;
  long lVar10;
  uint local_40;
  uint local_3c [3];
  
  local_3c[0] = corner.value_;
  if (corner.value_ == 0xffffffff) {
    local_3c[1] = -1;
    local_3c[2] = -1;
  }
  else {
    local_3c[1] = corner.value_ - 2;
    if (0x55555555 < corner.value_ * -0x55555555 + 0xaaaaaaab) {
      local_3c[1] = corner.value_ + 1;
    }
    if (corner.value_ * -0x55555555 < 0x55555556) {
      local_3c[2] = corner.value_ + 2;
    }
    else {
      local_3c[2] = corner.value_ - 1;
    }
  }
  lVar10 = 0;
  do {
    uVar1 = local_3c[lVar10];
    if ((ulong)uVar1 == 0xffffffff) {
      pAVar6 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
LAB_0012164a:
      if (pAVar7 != pAVar6) {
        uVar8 = 0;
        uVar5 = 1;
        do {
          iVar2._M_current =
               pAVar6[uVar8].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              pAVar6[uVar8].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_40 = uVar1;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&pAVar6[uVar8].attribute_seam_corners,iVar2,(int *)&local_40);
            pAVar6 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pAVar7 = (this->attribute_data_).
                     super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          else {
            *iVar2._M_current = uVar1;
            pAVar6[uVar8].attribute_seam_corners.super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
            local_40 = uVar1;
          }
          uVar8 = ((long)pAVar7 - (long)pAVar6 >> 6) * -0x3333333333333333;
          bVar4 = uVar5 <= uVar8;
          lVar3 = uVar8 - uVar5;
          uVar8 = uVar5;
          uVar5 = (ulong)((int)uVar5 + 1);
        } while (bVar4 && lVar3 != 0);
      }
    }
    else {
      pAVar6 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pAVar7 = (this->attribute_data_).
               super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (*(int *)(*(long *)&(((this->corner_table_)._M_t.
                               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl)->
                             opposite_corners_).vector_.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                  + (ulong)uVar1 * 4) == -1) goto LAB_0012164a;
      if (pAVar7 != pAVar6) {
        uVar9 = 1;
        uVar8 = 0;
        do {
          bVar4 = RAnsBitDecoder::DecodeNextBit
                            ((this->traversal_decoder_).attribute_connectivity_decoders_._M_t.
                             super___uniq_ptr_impl<draco::RAnsBitDecoder,_std::default_delete<draco::RAnsBitDecoder[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_draco::RAnsBitDecoder_*,_std::default_delete<draco::RAnsBitDecoder[]>_>
                             .super__Head_base<0UL,_draco::RAnsBitDecoder_*,_false>._M_head_impl +
                             (int)(uVar9 - 1));
          pAVar6 = (this->attribute_data_).
                   super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (bVar4) {
            iVar2._M_current =
                 *(pointer *)
                  ((long)&pAVar6[uVar8].attribute_seam_corners.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
            if (iVar2._M_current ==
                *(pointer *)
                 ((long)&pAVar6[uVar8].attribute_seam_corners.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10)) {
              local_40 = uVar1;
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&pAVar6[uVar8].attribute_seam_corners,iVar2,(int *)&local_40);
              pAVar6 = (this->attribute_data_).
                       super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *iVar2._M_current = uVar1;
              *(int **)((long)&pAVar6[uVar8].attribute_seam_corners.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) =
                   iVar2._M_current + 1;
              local_40 = uVar1;
            }
          }
          uVar8 = (ulong)uVar9;
          uVar5 = ((long)(this->attribute_data_).
                         super__Vector_base<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerDecoderImpl<draco::MeshEdgebreakerTraversalDecoder>::AttributeData>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6 >> 6) *
                  -0x3333333333333333;
          uVar9 = uVar9 + 1;
        } while (uVar8 <= uVar5 && uVar5 - uVar8 != 0);
      }
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 3) {
      return true;
    }
  } while( true );
}

Assistant:

bool MeshEdgebreakerDecoderImpl<TraversalDecoder>::
    DecodeAttributeConnectivitiesOnFaceLegacy(CornerIndex corner) {
  // Three corners of the face.
  const CornerIndex corners[3] = {corner, corner_table_->Next(corner),
                                  corner_table_->Previous(corner)};

  for (int c = 0; c < 3; ++c) {
    const CornerIndex opp_corner = corner_table_->Opposite(corners[c]);
    if (opp_corner == kInvalidCornerIndex) {
      // Don't decode attribute seams on boundary edges (every boundary edge
      // is automatically an attribute seam).
      for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
      continue;
    }

    for (uint32_t i = 0; i < attribute_data_.size(); ++i) {
      const bool is_seam = traversal_decoder_.DecodeAttributeSeam(i);
      if (is_seam) {
        attribute_data_[i].attribute_seam_corners.push_back(corners[c].value());
      }
    }
  }
  return true;
}